

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_save_output(fasttext_t *handle,char *filename,char **errptr)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,filename,&local_39);
  fasttext::FastText::saveOutput((FastText *)handle,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cft_fasttext_save_output(fasttext_t* handle, const char* filename, char** errptr) {
    try {
        ((FastText*)handle)->saveOutput(filename);
    } catch (const std::invalid_argument& e) {
        save_error(errptr, e);
    }
}